

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressor.cpp
# Opt level: O2

void __thiscall Imf_2_5::DwaCompressor::LossyDctEncoderBase::execute(LossyDctEncoderBase *this)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  pointer pSVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  unsigned_short *puVar11;
  bool bVar12;
  uint uVar13;
  half hVar14;
  ushort uVar15;
  uint uVar16;
  __m128 *srcVec;
  ulong uVar17;
  int iter;
  LossyDctEncoderBase *this_00;
  ulong uVar18;
  int x;
  int iVar19;
  int y;
  long lVar20;
  uint uVar21;
  uint uVar22;
  pointer pvVar23;
  int iVar24;
  LossyDctEncoderBase *pLVar25;
  int i;
  uint uVar26;
  vector<Imf_2_5::SimdAlignedBuffer64<float>,_std::allocator<Imf_2_5::SimdAlignedBuffer64<float>_>_>
  *pvVar27;
  LossyDctEncoderBase *pLVar28;
  long lVar29;
  pointer puVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float src;
  unsigned_short tmpShortNative;
  half local_1e2;
  LossyDctEncoderBase *local_1e0;
  half local_1d2;
  vector<Imf_2_5::SimdAlignedBuffer64<float>,_std::allocator<Imf_2_5::SimdAlignedBuffer64<float>_>_>
  *local_1d0;
  char *srcXdr;
  ulong local_1c0;
  ulong local_1b8;
  ulong local_1b0;
  ulong local_1a8;
  char *dstXdr;
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  unsigned_short *currAcComp;
  vector<unsigned_short_*,_std::allocator<unsigned_short_*>_> currDcComp;
  vector<unsigned_short,_std::allocator<unsigned_short>_> tmpHalfBuffer;
  half halfZigCoef [64];
  half halfCoef [64];
  
  fVar31 = ceilf((float)this->_width * 0.125);
  local_1e0 = (LossyDctEncoderBase *)CONCAT44(local_1e0._4_4_,fVar31);
  local_198._0_4_ = ceilf((float)this->_height * 0.125);
  std::vector<unsigned_short_*,_std::allocator<unsigned_short_*>_>::vector
            (&currDcComp,
             ((long)(this->_rowPtrs).
                    super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->_rowPtrs).
                   super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x18,
             (allocator_type *)&tmpHalfBuffer);
  currAcComp = (unsigned_short *)this->_packedAc;
  local_1d0 = &this->_dctData;
  std::
  vector<Imf_2_5::SimdAlignedBuffer64<float>,_std::allocator<Imf_2_5::SimdAlignedBuffer64<float>_>_>
  ::resize(local_1d0,
           ((long)(this->_rowPtrs).
                  super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->_rowPtrs).
                 super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start) / 0x18);
  local_1b8 = (ulong)(uint)(int)local_1e0._0_4_;
  local_1c0 = (ulong)(uint)(int)(float)local_198._0_4_;
  this->_numAcComp = 0;
  this->_numDcComp = 0;
  iVar19 = 0;
  for (uVar21 = 0;
      (ulong)uVar21 <
      (ulong)(((long)(this->_rowPtrs).
                     super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->_rowPtrs).
                    super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0x18); uVar21 = uVar21 + 1) {
    iVar24 = 0;
    if ((this->_type).super__Vector_base<Imf_2_5::PixelType,_std::allocator<Imf_2_5::PixelType>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar21] == FLOAT) {
      iVar24 = this->_height * this->_width;
    }
    iVar19 = iVar19 + iVar24;
  }
  local_1e0 = this;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            (&tmpHalfBuffer,(long)iVar19,(allocator_type *)&srcXdr);
  uVar21 = 0;
  puVar30 = tmpHalfBuffer.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (iVar19 == 0) {
    puVar30 = (pointer)0x0;
  }
  pLVar28 = local_1e0;
  for (; uVar18 = (ulong)uVar21,
      uVar18 < (ulong)(((long)(pLVar28->_rowPtrs).
                              super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pLVar28->_rowPtrs).
                             super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) / 0x18); uVar21 = uVar21 + 1
      ) {
    if ((pLVar28->_type).super__Vector_base<Imf_2_5::PixelType,_std::allocator<Imf_2_5::PixelType>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar18] == FLOAT) {
      local_1a8 = uVar18 * 0x18;
      local_1b0 = uVar18;
      for (lVar20 = 0; lVar20 < pLVar28->_height; lVar20 = lVar20 + 1) {
        src = 0.0;
        srcXdr = *(char **)(*(long *)((long)&(((pLVar28->_rowPtrs).
                                               super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->
                                             super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                             )._M_impl.super__Vector_impl_data + local_1a8) +
                           lVar20 * 8);
        dstXdr = (char *)puVar30;
        for (iVar19 = 0; iVar24 = pLVar28->_width, iVar19 < iVar24; iVar19 = iVar19 + 1) {
          Xdr::read<Imf_2_5::CharPtrIO,char_const*>(&srcXdr,&src);
          hVar14 = std::numeric_limits<half>::max();
          local_198 = ZEXT416(*(uint *)((long)&half::_toFloat + (ulong)hVar14._h * 4));
          local_188 = ZEXT416((uint)src);
          hVar14 = std::numeric_limits<half>::max();
          fVar31 = *(float *)((long)&half::_toFloat + (ulong)(hVar14._h ^ 0x8000) * 4);
          fVar32 = (float)((uint)src & -(uint)((float)local_188._0_4_ < (float)local_198._0_4_) |
                          ~-(uint)((float)local_188._0_4_ < (float)local_198._0_4_) &
                          local_198._0_4_);
          src = fVar31;
          if (fVar31 <= fVar32) {
            src = fVar32;
          }
          half::half((half *)&tmpShortNative,src);
          Xdr::write<Imf_2_5::CharPtrIO,char*>(&dstXdr,tmpShortNative);
          pLVar28 = local_1e0;
        }
        *(pointer *)
         (*(long *)((long)&(((pLVar28->_rowPtrs).
                             super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
                           super__Vector_impl_data + local_1a8) + lVar20 * 8) = puVar30;
        puVar30 = puVar30 + iVar24;
      }
      uVar21 = (uint)local_1b0;
    }
  }
  *currDcComp.super__Vector_base<unsigned_short_*,_std::allocator<unsigned_short_*>_>._M_impl.
   super__Vector_impl_data._M_start = (unsigned_short *)pLVar28->_packedDc;
  iVar19 = (int)local_1c0;
  uVar21 = 0;
  while( true ) {
    uVar26 = uVar21 + 1;
    pvVar23 = (pLVar28->_rowPtrs).
              super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    this_00 = (LossyDctEncoderBase *)
              (pLVar28->_rowPtrs).
              super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)(((long)this_00 - (long)pvVar23) / 0x18) <= (ulong)uVar26) break;
    currDcComp.super__Vector_base<unsigned_short_*,_std::allocator<unsigned_short_*>_>._M_impl.
    super__Vector_impl_data._M_start[uVar26] =
         currDcComp.super__Vector_base<unsigned_short_*,_std::allocator<unsigned_short_*>_>._M_impl.
         super__Vector_impl_data._M_start[uVar21] + iVar19 * (int)local_1b8;
    uVar21 = uVar26;
  }
  uVar18 = 0;
  bVar12 = (int)local_1b8 < 1;
  local_1b8 = local_1b8 & 0xffffffff;
  if (bVar12) {
    local_1b8 = uVar18;
  }
  pLVar25 = this_00;
  pvVar27 = local_1d0;
  local_1c0 = local_1c0 & 0xffffffff;
  if (iVar19 < 1) {
    local_1c0 = uVar18;
  }
  while (uVar18 != local_1c0) {
    local_188._0_8_ = uVar18 * 8;
    uVar17 = 0;
    local_1b0 = uVar18;
    while (uVar17 != local_1b8) {
      uVar21 = 0;
      local_1a8 = uVar17;
      while( true ) {
        uVar18 = (ulong)uVar21;
        if ((ulong)(((long)this_00 - (long)pvVar23) / 0x18) <= uVar18) break;
        lVar29 = 0;
        lVar20 = 0;
        while (lVar20 != 8) {
          local_198._0_8_ = lVar20;
          uVar26 = (uint)lVar20 | local_188._0_4_;
          for (lVar20 = 0; lVar20 != 8; lVar20 = lVar20 + 1) {
            uVar16 = (uint)lVar20 | (int)uVar17 * 8;
            iVar19 = pLVar28->_width;
            iVar24 = pLVar28->_height;
            uVar22 = ~uVar16 + iVar19 * 2;
            if ((int)uVar16 < iVar19) {
              uVar22 = uVar16;
            }
            uVar16 = iVar19 - 1;
            if (-1 < (int)uVar22) {
              uVar16 = uVar22;
            }
            uVar22 = ~uVar26 + iVar24 * 2;
            if ((int)uVar26 < iVar24) {
              uVar22 = uVar26;
            }
            uVar13 = iVar24 - 1;
            if (-1 < (int)uVar22) {
              uVar13 = uVar22;
            }
            uVar15 = *(ushort *)
                      (*(long *)(*(long *)&(pLVar28->_rowPtrs).
                                           super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start[uVar18].
                                           super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                           ._M_impl.super__Vector_impl_data + (long)(int)uVar13 * 8)
                      + (long)(int)uVar16 * 2);
            src = (float)CONCAT22(src._2_2_,uVar15);
            if (pLVar28->_toNonlinear == (unsigned_short *)0x0) {
              dstXdr = (char *)&src;
              Xdr::read<Imf_2_5::CharPtrIO,char_const*>(&dstXdr,&tmpShortNative);
              pvVar27 = local_1d0;
              pLVar28 = local_1e0;
              uVar15 = tmpShortNative;
            }
            else {
              uVar15 = pLVar28->_toNonlinear[uVar15];
            }
            *(undefined4 *)
             ((long)(pvVar27->
                    super__Vector_base<Imf_2_5::SimdAlignedBuffer64<float>,_std::allocator<Imf_2_5::SimdAlignedBuffer64<float>_>_>
                    )._M_impl.super__Vector_impl_data._M_start[uVar18]._buffer + lVar20 * 4 + lVar29
             ) = *(undefined4 *)((long)&half::_toFloat + (ulong)uVar15 * 4);
          }
          lVar29 = lVar29 + 0x20;
          lVar20 = local_198._0_8_ + 1;
        }
        uVar21 = uVar21 + 1;
        pvVar23 = (pLVar28->_rowPtrs).
                  super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        this_00 = (LossyDctEncoderBase *)
                  (pLVar28->_rowPtrs).
                  super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        pLVar25 = this_00;
      }
      if ((long)this_00 - (long)pvVar23 == 0x48) {
        pSVar7 = (pvVar27->
                 super__Vector_base<Imf_2_5::SimdAlignedBuffer64<float>,_std::allocator<Imf_2_5::SimdAlignedBuffer64<float>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pfVar8 = pSVar7->_buffer;
        pfVar9 = pSVar7[1]._buffer;
        pfVar10 = pSVar7[2]._buffer;
        for (lVar20 = 0; lVar20 != 0x40; lVar20 = lVar20 + 1) {
          fVar31 = pfVar8[lVar20];
          fVar32 = pfVar9[lVar20];
          fVar33 = pfVar10[lVar20];
          pfVar8[lVar20] = fVar33 * 0.0722 + fVar31 * 0.2126 + fVar32 * 0.7152;
          pfVar9[lVar20] = fVar33 * 0.5 + fVar31 * -0.1146 + fVar32 * -0.3854;
          pfVar10[lVar20] = fVar33 * -0.0458 + fVar31 * 0.5 + fVar32 * -0.4542;
        }
      }
      this_00 = pLVar25;
      for (uVar21 = 0; uVar18 = (ulong)uVar21,
          uVar18 < (ulong)(((long)this_00 - (long)pvVar23) / 0x18); uVar21 = uVar21 + 1) {
        pfVar8 = (pvVar27->
                 super__Vector_base<Imf_2_5::SimdAlignedBuffer64<float>,_std::allocator<Imf_2_5::SimdAlignedBuffer64<float>_>_>
                 )._M_impl.super__Vector_impl_data._M_start[uVar18]._buffer;
        for (iVar19 = 0; iVar19 != 2; iVar19 = iVar19 + 1) {
          for (lVar20 = 0xe0; lVar20 != 0x100; lVar20 = lVar20 + 0x10) {
            pfVar9 = (float *)((long)pfVar8 + lVar20);
            pfVar4 = (float *)((long)pfVar8 + lVar20 + -0xe0);
            pfVar5 = (float *)((long)pfVar8 + lVar20 + -0xc0);
            pfVar6 = (float *)((long)pfVar8 + lVar20 + -0xa0);
            pfVar10 = (float *)((long)pfVar8 + lVar20 + -0x80);
            fVar51 = *pfVar4 + *pfVar9;
            fVar52 = pfVar4[1] + pfVar9[1];
            fVar53 = pfVar4[2] + pfVar9[2];
            fVar54 = pfVar4[3] + pfVar9[3];
            fVar31 = *pfVar5 + *pfVar6;
            fVar32 = pfVar5[1] + pfVar6[1];
            fVar33 = pfVar5[2] + pfVar6[2];
            fVar34 = pfVar5[3] + pfVar6[3];
            pfVar1 = (float *)((long)pfVar8 + lVar20 + -0x60);
            fVar59 = *pfVar10 + *pfVar1;
            fVar60 = pfVar10[1] + pfVar1[1];
            fVar61 = pfVar10[2] + pfVar1[2];
            fVar62 = pfVar10[3] + pfVar1[3];
            pfVar2 = (float *)((long)pfVar8 + lVar20 + -0x40);
            pfVar3 = (float *)((long)pfVar8 + lVar20 + -0x20);
            fVar39 = *pfVar4 - *pfVar9;
            fVar40 = pfVar4[1] - pfVar9[1];
            fVar41 = pfVar4[2] - pfVar9[2];
            fVar42 = pfVar4[3] - pfVar9[3];
            fVar55 = *pfVar2 + *pfVar3;
            fVar56 = pfVar2[1] + pfVar3[1];
            fVar57 = pfVar2[2] + pfVar3[2];
            fVar58 = pfVar2[3] + pfVar3[3];
            fVar47 = *pfVar5 - *pfVar6;
            fVar48 = pfVar5[1] - pfVar6[1];
            fVar49 = pfVar5[2] - pfVar6[2];
            fVar50 = pfVar5[3] - pfVar6[3];
            fVar43 = *pfVar10 - *pfVar1;
            fVar44 = pfVar10[1] - pfVar1[1];
            fVar45 = pfVar10[2] - pfVar1[2];
            fVar46 = pfVar10[3] - pfVar1[3];
            fVar35 = *pfVar2 - *pfVar3;
            fVar36 = pfVar2[1] - pfVar3[1];
            fVar37 = pfVar2[2] - pfVar3[2];
            fVar38 = pfVar2[3] - pfVar3[3];
            fVar63 = (fVar51 + fVar59) * 0.70710677;
            fVar64 = (fVar52 + fVar60) * 0.70710677;
            fVar65 = (fVar53 + fVar61) * 0.70710677;
            fVar66 = (fVar54 + fVar62) * 0.70710677;
            fVar67 = (fVar31 + fVar55) * 0.70710677;
            fVar68 = (fVar32 + fVar56) * 0.70710677;
            fVar69 = (fVar33 + fVar57) * 0.70710677;
            fVar70 = (fVar34 + fVar58) * 0.70710677;
            pfVar9 = (float *)((long)pfVar8 + lVar20 + -0xe0);
            *pfVar9 = (fVar63 + fVar67) * 0.5;
            pfVar9[1] = (fVar64 + fVar68) * 0.5;
            pfVar9[2] = (fVar65 + fVar69) * 0.5;
            pfVar9[3] = (fVar66 + fVar70) * 0.5;
            pfVar9 = (float *)((long)pfVar8 + lVar20 + -0x60);
            *pfVar9 = (fVar63 - fVar67) * 0.5;
            pfVar9[1] = (fVar64 - fVar68) * 0.5;
            pfVar9[2] = (fVar65 - fVar69) * 0.5;
            pfVar9[3] = (fVar66 - fVar70) * 0.5;
            fVar63 = fVar47 - fVar35;
            fVar64 = fVar48 - fVar36;
            fVar65 = fVar49 - fVar37;
            fVar66 = fVar50 - fVar38;
            fVar51 = fVar51 - fVar59;
            fVar52 = fVar52 - fVar60;
            fVar53 = fVar53 - fVar61;
            fVar54 = fVar54 - fVar62;
            pfVar9 = (float *)((long)pfVar8 + lVar20 + -0xa0);
            *pfVar9 = fVar51 * 0.46193978 + fVar63 * 0.19134171;
            pfVar9[1] = fVar52 * 0.46193978 + fVar64 * 0.19134171;
            pfVar9[2] = fVar53 * 0.46193978 + fVar65 * 0.19134171;
            pfVar9[3] = fVar54 * 0.46193978 + fVar66 * 0.19134171;
            pfVar9 = (float *)((long)pfVar8 + lVar20 + -0x20);
            *pfVar9 = fVar51 * 0.19134171 - fVar63 * 0.46193978;
            pfVar9[1] = fVar52 * 0.19134171 - fVar64 * 0.46193978;
            pfVar9[2] = fVar53 * 0.19134171 - fVar65 * 0.46193978;
            pfVar9[3] = fVar54 * 0.19134171 - fVar66 * 0.46193978;
            fVar31 = (fVar31 - fVar55) * 0.70710677;
            fVar32 = (fVar32 - fVar56) * 0.70710677;
            fVar33 = (fVar33 - fVar57) * 0.70710677;
            fVar34 = (fVar34 - fVar58) * 0.70710677;
            fVar35 = (fVar35 + fVar47) * -0.70710677;
            fVar36 = (fVar36 + fVar48) * -0.70710677;
            fVar37 = (fVar37 + fVar49) * -0.70710677;
            fVar38 = (fVar38 + fVar50) * -0.70710677;
            fVar47 = fVar39 - fVar31;
            fVar48 = fVar40 - fVar32;
            fVar49 = fVar41 - fVar33;
            fVar50 = fVar42 - fVar34;
            fVar51 = fVar43 + fVar35;
            fVar52 = fVar44 + fVar36;
            fVar53 = fVar45 + fVar37;
            fVar54 = fVar46 + fVar38;
            pfVar9 = (float *)((long)pfVar8 + lVar20 + -0x80);
            *pfVar9 = fVar47 * 0.4157348 - fVar51 * 0.27778512;
            pfVar9[1] = fVar48 * 0.4157348 - fVar52 * 0.27778512;
            pfVar9[2] = fVar49 * 0.4157348 - fVar53 * 0.27778512;
            pfVar9[3] = fVar50 * 0.4157348 - fVar54 * 0.27778512;
            pfVar9 = (float *)((long)pfVar8 + lVar20 + -0x40);
            *pfVar9 = fVar51 * 0.4157348 + fVar47 * 0.27778512;
            pfVar9[1] = fVar52 * 0.4157348 + fVar48 * 0.27778512;
            pfVar9[2] = fVar53 * 0.4157348 + fVar49 * 0.27778512;
            pfVar9[3] = fVar54 * 0.4157348 + fVar50 * 0.27778512;
            fVar31 = fVar31 + fVar39;
            fVar32 = fVar32 + fVar40;
            fVar33 = fVar33 + fVar41;
            fVar34 = fVar34 + fVar42;
            fVar35 = fVar35 - fVar43;
            fVar36 = fVar36 - fVar44;
            fVar37 = fVar37 - fVar45;
            fVar38 = fVar38 - fVar46;
            pfVar9 = (float *)((long)pfVar8 + lVar20 + -0xc0);
            *pfVar9 = fVar31 * 0.49039263 - fVar35 * 0.09754516;
            pfVar9[1] = fVar32 * 0.49039263 - fVar36 * 0.09754516;
            pfVar9[2] = fVar33 * 0.49039263 - fVar37 * 0.09754516;
            pfVar9[3] = fVar34 * 0.49039263 - fVar38 * 0.09754516;
            pfVar9 = (float *)((long)pfVar8 + lVar20);
            *pfVar9 = fVar35 * 0.49039263 + fVar31 * 0.09754516;
            pfVar9[1] = fVar36 * 0.49039263 + fVar32 * 0.09754516;
            pfVar9[2] = fVar37 * 0.49039263 + fVar33 * 0.09754516;
            pfVar9[3] = fVar38 * 0.49039263 + fVar34 * 0.09754516;
          }
          fVar31 = pfVar8[1];
          fVar32 = pfVar8[2];
          fVar33 = pfVar8[3];
          fVar34 = pfVar8[0xb];
          fVar35 = pfVar8[0x11];
          fVar36 = pfVar8[0x13];
          fVar37 = pfVar8[0x25];
          fVar38 = pfVar8[0x26];
          fVar39 = pfVar8[0x27];
          fVar40 = pfVar8[0x2f];
          fVar41 = pfVar8[0x35];
          fVar42 = pfVar8[0x37];
          *pfVar8 = *pfVar8;
          pfVar8[1] = pfVar8[8];
          pfVar8[2] = pfVar8[0x10];
          pfVar8[3] = pfVar8[0x18];
          pfVar8[0x10] = fVar32;
          pfVar8[0x11] = pfVar8[10];
          pfVar8[0x12] = pfVar8[0x12];
          pfVar8[0x13] = pfVar8[0x1a];
          pfVar8[8] = fVar31;
          pfVar8[9] = pfVar8[9];
          pfVar8[10] = fVar35;
          pfVar8[0xb] = pfVar8[0x19];
          pfVar8[0x18] = fVar33;
          pfVar8[0x19] = fVar34;
          pfVar8[0x1a] = fVar36;
          pfVar8[0x1b] = pfVar8[0x1b];
          pfVar8[0x24] = pfVar8[0x24];
          pfVar8[0x25] = pfVar8[0x2c];
          pfVar8[0x26] = pfVar8[0x34];
          pfVar8[0x27] = pfVar8[0x3c];
          pfVar8[0x34] = fVar38;
          pfVar8[0x35] = pfVar8[0x2e];
          pfVar8[0x36] = pfVar8[0x36];
          pfVar8[0x37] = pfVar8[0x3e];
          pfVar8[0x2c] = fVar37;
          pfVar8[0x2d] = pfVar8[0x2d];
          pfVar8[0x2e] = fVar41;
          pfVar8[0x2f] = pfVar8[0x3d];
          pfVar8[0x3c] = fVar39;
          pfVar8[0x3d] = fVar40;
          pfVar8[0x3e] = fVar42;
          pfVar8[0x3f] = pfVar8[0x3f];
          fVar31 = pfVar8[0x20];
          fVar32 = pfVar8[0x21];
          fVar33 = pfVar8[0x22];
          fVar34 = pfVar8[0x23];
          fVar35 = pfVar8[0x28];
          fVar36 = pfVar8[0x29];
          fVar37 = pfVar8[0x2a];
          fVar38 = pfVar8[0x2b];
          fVar39 = pfVar8[0x30];
          fVar40 = pfVar8[0x31];
          fVar41 = pfVar8[0x32];
          fVar42 = pfVar8[0x33];
          fVar43 = pfVar8[0x38];
          fVar44 = pfVar8[0x39];
          fVar45 = pfVar8[0x3a];
          fVar46 = pfVar8[0x3b];
          pfVar8[0x20] = pfVar8[4];
          pfVar8[0x21] = pfVar8[0xc];
          pfVar8[0x22] = pfVar8[0x14];
          pfVar8[0x23] = pfVar8[0x1c];
          pfVar8[0x30] = pfVar8[6];
          pfVar8[0x31] = pfVar8[0xe];
          pfVar8[0x32] = pfVar8[0x16];
          pfVar8[0x33] = pfVar8[0x1e];
          pfVar8[0x28] = pfVar8[5];
          pfVar8[0x29] = pfVar8[0xd];
          pfVar8[0x2a] = pfVar8[0x15];
          pfVar8[0x2b] = pfVar8[0x1d];
          pfVar8[0x38] = pfVar8[7];
          pfVar8[0x39] = pfVar8[0xf];
          pfVar8[0x3a] = pfVar8[0x17];
          pfVar8[0x3b] = pfVar8[0x1f];
          pfVar8[4] = fVar31;
          pfVar8[5] = fVar35;
          pfVar8[6] = fVar39;
          pfVar8[7] = fVar43;
          pfVar8[0x14] = fVar33;
          pfVar8[0x15] = fVar37;
          pfVar8[0x16] = fVar41;
          pfVar8[0x17] = fVar45;
          pfVar8[0xc] = fVar32;
          pfVar8[0xd] = fVar36;
          pfVar8[0xe] = fVar40;
          pfVar8[0xf] = fVar44;
          pfVar8[0x1c] = fVar34;
          pfVar8[0x1d] = fVar38;
          pfVar8[0x1e] = fVar42;
          pfVar8[0x1f] = fVar46;
        }
        lVar20 = 0;
        if (uVar18 == 0) {
          for (; lVar20 != 0x40; lVar20 = lVar20 + 1) {
            this_00 = (LossyDctEncoderBase *)&local_1d2;
            half::half((half *)this_00,
                       ((pvVar27->
                        super__Vector_base<Imf_2_5::SimdAlignedBuffer64<float>,_std::allocator<Imf_2_5::SimdAlignedBuffer64<float>_>_>
                        )._M_impl.super__Vector_impl_data._M_start)->_buffer[lVar20]);
            hVar14 = quantize(this_00,local_1d2,
                              local_1e0->_quantBaseError * local_1e0->_quantTableY[lVar20]);
            halfCoef[lVar20]._h = hVar14._h;
            pvVar27 = local_1d0;
          }
        }
        else {
          for (; lVar20 != 0x40; lVar20 = lVar20 + 1) {
            this_00 = (LossyDctEncoderBase *)&local_1e2;
            half::half(&local_1e2,
                       (pvVar27->
                       super__Vector_base<Imf_2_5::SimdAlignedBuffer64<float>,_std::allocator<Imf_2_5::SimdAlignedBuffer64<float>_>_>
                       )._M_impl.super__Vector_impl_data._M_start[uVar18]._buffer[lVar20]);
            hVar14 = quantize(this_00,local_1e2,
                              local_1e0->_quantBaseError * local_1e0->_quantTableCbCr[lVar20]);
            halfCoef[lVar20]._h = hVar14._h;
            pvVar27 = local_1d0;
          }
        }
        toZigZag(this_00,halfZigCoef,halfCoef);
        for (lVar20 = 0; pLVar28 = local_1e0, lVar20 != 0x40; lVar20 = lVar20 + 1) {
          srcXdr = (char *)&src;
          Xdr::write<Imf_2_5::CharPtrIO,char*>(&srcXdr,halfZigCoef[lVar20]._h);
          halfZigCoef[lVar20]._h = src._0_2_;
        }
        puVar11 = currDcComp.super__Vector_base<unsigned_short_*,_std::allocator<unsigned_short_*>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar18];
        currDcComp.super__Vector_base<unsigned_short_*,_std::allocator<unsigned_short_*>_>._M_impl.
        super__Vector_impl_data._M_start[uVar18] = puVar11 + 1;
        *puVar11 = halfZigCoef[0]._h;
        local_1e0->_numDcComp = local_1e0->_numDcComp + 1;
        rleAc(local_1e0,halfZigCoef,&currAcComp);
        pvVar23 = (pLVar28->_rowPtrs).
                  super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        this_00 = (LossyDctEncoderBase *)
                  (pLVar28->_rowPtrs).
                  super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        pvVar27 = local_1d0;
      }
      pLVar25 = this_00;
      uVar17 = local_1a8 + 1;
    }
    uVar18 = local_1b0 + 1;
  }
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
            (&tmpHalfBuffer.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>);
  std::_Vector_base<unsigned_short_*,_std::allocator<unsigned_short_*>_>::~_Vector_base
            (&currDcComp.super__Vector_base<unsigned_short_*,_std::allocator<unsigned_short_*>_>);
  return;
}

Assistant:

void
DwaCompressor::LossyDctEncoderBase::execute ()
{
    int  numBlocksX   = (int)ceil ((float)_width / 8.0f);
    int  numBlocksY   = (int)ceil ((float)_height/ 8.0f);

    half halfZigCoef[64]; 
    half halfCoef[64];

    std::vector<unsigned short *> currDcComp (_rowPtrs.size());
    unsigned short               *currAcComp = (unsigned short *)_packedAc;

    _dctData.resize (_rowPtrs.size());
    _numAcComp = 0;
    _numDcComp = 0;
 
    assert (_type.size() == _rowPtrs.size());
    assert ((_rowPtrs.size() == 3) || (_rowPtrs.size() == 1));

    // 
    // Allocate a temp half buffer to quantize into for
    // any FLOAT source channels.
    //

    int tmpHalfBufferElements = 0;

    for (unsigned int chan = 0; chan < _rowPtrs.size(); ++chan)
        if (_type[chan] == FLOAT)
            tmpHalfBufferElements += _width * _height;

    std::vector<unsigned short> tmpHalfBuffer (tmpHalfBufferElements);

    char *tmpHalfBufferPtr = 0;

    if (tmpHalfBufferElements)
        tmpHalfBufferPtr = (char *)&tmpHalfBuffer[0];

    //
    // Run over all the float scanlines, quantizing, 
    // and re-assigning _rowPtr[y]. We need to translate
    // FLOAT XDR to HALF XDR.
    //

    for (unsigned int chan = 0; chan < _rowPtrs.size(); ++chan)
    {
        if (_type[chan] != FLOAT)
            continue;
    
        for (int y = 0; y < _height; ++y)
        {
            float       src = 0;
            const char *srcXdr = _rowPtrs[chan][y];
            char       *dstXdr = tmpHalfBufferPtr;
           
            for (int x = 0; x < _width; ++x)
            {

                Xdr::read<CharPtrIO> (srcXdr, src);

                //
                // Clamp to half ranges, instead of just casting. This
                // avoids introducing Infs which end up getting zeroed later
                //
                src = std::max (
                    std::min ((float) std::numeric_limits<half>::max(), src),
                              (float)-std::numeric_limits<half>::max());

                Xdr::write<CharPtrIO> (dstXdr, ((half)src).bits());

                //
                // Xdr::read and Xdr::write will advance the ptr
                //
            }

            _rowPtrs[chan][y] = (const char *)tmpHalfBufferPtr;
            tmpHalfBufferPtr += _width * sizeof (unsigned short);
        }
    }

    //
    // Pack DC components together by common plane, so we can get 
    // a little more out of differencing them. We'll always have 
    // one component per block, so we can computed offsets.
    //

    currDcComp[0] = (unsigned short *)_packedDc;

    for (unsigned int chan = 1; chan < _rowPtrs.size(); ++chan)
        currDcComp[chan] = currDcComp[chan-1] + numBlocksX * numBlocksY;

    for (int blocky = 0; blocky < numBlocksY; ++blocky)
    {
        for (int blockx = 0; blockx < numBlocksX; ++blockx)
        {
            half           h;
            unsigned short tmpShortXdr, tmpShortNative;
            char          *tmpCharPtr;

            for (unsigned int chan = 0; chan < _rowPtrs.size(); ++chan)
            {
                //
                // Break the source into 8x8 blocks. If we don't
                // fit at the edges, mirror.
                //
                // Also, convert from linear to nonlinear representation.
                // Our source is assumed to be XDR, and we need to convert
                // to NATIVE prior to converting to float.
                //
                // If we're converting linear -> nonlinear, assume that the
                // XDR -> NATIVE conversion is built into the lookup. Otherwise,
                // we'll need to explicitly do it.
                //

                for (int y = 0; y < 8; ++y)
                {
                    for (int x = 0; x < 8; ++x)
                    {
                        int vx = 8 * blockx + x;
                        int vy = 8 * blocky + y;

                        if (vx >= _width)
                            vx = _width - (vx - (_width - 1));
                        
                        if (vx < 0) vx = _width-1;

                        if (vy >=_height)
                            vy = _height - (vy - (_height - 1));

                        if (vy < 0) vy = _height-1;
                    
                        tmpShortXdr =
                            ((const unsigned short *)(_rowPtrs[chan])[vy])[vx];

                        if (_toNonlinear)
                        {
                            h.setBits (_toNonlinear[tmpShortXdr]);
                        }
                        else
                        {
                            const char *tmpConstCharPtr =
                                (const char *)(&tmpShortXdr);

                            Xdr::read<CharPtrIO>
                                (tmpConstCharPtr, tmpShortNative);

                            h.setBits(tmpShortNative);
                        }

                        _dctData[chan]._buffer[y * 8 + x] = (float)h;
                    } // x
                } // y
            } // chan

            //
            // Color space conversion
            //

            if (_rowPtrs.size() == 3)
            {
                csc709Forward64 (_dctData[0]._buffer, 
                                 _dctData[1]._buffer, 
                                 _dctData[2]._buffer);
            }

            for (unsigned int chan = 0; chan < _rowPtrs.size(); ++chan)
            {
                //
                // Forward DCT
                //

                dctForward8x8(_dctData[chan]._buffer);

                //
                // Quantize to half, and zigzag
                //

                if (chan == 0)
                {
                    for (int i = 0; i < 64; ++i)
                    {
                        halfCoef[i] =
                            quantize ((half)_dctData[chan]._buffer[i],
                                      _quantBaseError*_quantTableY[i]);
                    }
                }
                else
                {
                    for (int i = 0; i < 64; ++i)
                    {
                        halfCoef[i] =
                            quantize ((half)_dctData[chan]._buffer[i],
                                      _quantBaseError*_quantTableCbCr[i]);
                    }
                }

                toZigZag (halfZigCoef, halfCoef);
                
                //
                // Convert from NATIVE back to XDR, before we write out
                //

                for (int i = 0; i < 64; ++i)
                {
                    tmpCharPtr = (char *)&tmpShortXdr;
                    Xdr::write<CharPtrIO>(tmpCharPtr, halfZigCoef[i].bits());
                    halfZigCoef[i].setBits(tmpShortXdr);
                }

                //
                // Save the DC component separately, to be compressed on
                // its own.
                //

                *currDcComp[chan]++ = halfZigCoef[0].bits();
                _numDcComp++;
                
                //
                // Then RLE the AC components (which will record the count
                // of the resulting number of items)
                //

                rleAc (halfZigCoef, currAcComp);
            } // chan
        } // blockx
    } // blocky              
}